

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

uint32_t sse::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  uint in_ECX;
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  uint32_t output [4];
  uint8_t *imageXEnd;
  uint8_t *imageX;
  simd sumLoHi;
  simd dataHi;
  simd dataLo;
  simd data;
  simd *srcEnd;
  simd *src;
  simd zero;
  simd simdSum;
  uint32_t sum;
  int local_1e8;
  int iStack_1e4;
  int iStack_1e0;
  int iStack_1dc;
  byte *local_1d8;
  byte *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 (*local_188) [16];
  undefined1 (*local_180) [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  int local_158;
  undefined1 (*local_140) [16];
  undefined1 (*local_130) [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_158 = 0;
  local_f8 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_108 = (undefined1  [16])0x0;
  local_178 = (undefined1  [16])0x0;
  for (local_140 = in_RSI; local_140 != in_RDX;
      local_140 = (undefined1 (*) [16])(*local_140 + in_EDI)) {
    local_188 = local_140 + in_ECX;
    for (local_180 = local_140; local_180 != local_188; local_180 = local_180 + 1) {
      local_130 = local_180;
      local_198 = *(undefined8 *)*local_180;
      uStack_190 = *(undefined8 *)(*local_180 + 8);
      local_e8 = 0;
      uStack_e0 = 0;
      local_1a8 = vpunpcklbw_avx(*local_180,ZEXT816(0));
      local_c8 = 0;
      uStack_c0 = 0;
      local_1b8 = vpunpckhbw_avx(*local_180,ZEXT816(0));
      local_18 = local_1a8._0_8_;
      uStack_10 = local_1a8._8_8_;
      local_28 = local_1b8._0_8_;
      uStack_20 = local_1b8._8_8_;
      local_1c8 = vpaddw_avx(local_1a8,local_1b8);
      local_58 = local_168._0_8_;
      uStack_50 = local_168._8_8_;
      local_98 = local_1c8._0_8_;
      uStack_90 = local_1c8._8_8_;
      local_a8 = 0;
      uStack_a0 = 0;
      local_38 = vpunpcklwd_avx(local_1c8,ZEXT816(0));
      local_78 = local_1c8._0_8_;
      uStack_70 = local_1c8._8_8_;
      local_88 = 0;
      uStack_80 = 0;
      local_48 = vpunpckhwd_avx(local_1c8,ZEXT816(0));
      local_68 = vpaddd_avx(local_38,local_48);
      local_168 = vpaddd_avx(local_168,local_68);
      local_d8 = local_198;
      uStack_d0 = uStack_190;
      local_b8 = local_198;
      uStack_b0 = uStack_190;
    }
    if (in_R9D != 0) {
      local_1d0 = *local_140 + in_R8D;
      local_1d8 = local_1d0 + in_R9D;
      for (; local_1d0 != local_1d8; local_1d0 = local_1d0 + 1) {
        local_158 = (uint)*local_1d0 + local_158;
      }
    }
  }
  memset(&local_1e8,0,0x10);
  iStack_1e4 = local_168._4_4_;
  local_1e8 = local_168._0_4_;
  iStack_1dc = local_168._12_4_;
  iStack_1e0 = local_168._8_4_;
  return local_158 + local_1e8 + iStack_1e4 + iStack_1e0 + iStack_1dc;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm_setzero_si128();
        simd zero    = _mm_setzero_si128();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                simd dataLo  = _mm_unpacklo_epi8( data, zero );
                simd dataHi  = _mm_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm_add_epi16( dataLo, dataHi );

                simdSum = _mm_add_epi32( simdSum, _mm_add_epi32( _mm_unpacklo_epi16( sumLoHi, zero ),
                                                                 _mm_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[4] ={ 0 };

        _mm_storeu_si128( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3];
    }